

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

Option * __thiscall CLI::Option::check(Option *this,Validator *validator,string *validator_name)

{
  pointer pVVar1;
  string local_40 [32];
  
  validator->non_modifying_ = true;
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&this->validators_,validator);
  if (validator_name->_M_string_length != 0) {
    pVVar1 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::string(local_40,(string *)validator_name);
    ::std::__cxx11::string::operator=((string *)&pVVar1[-1].name_,local_40);
    ::std::__cxx11::string::~string(local_40);
  }
  return this;
}

Assistant:

Option *check(Validator validator, const std::string &validator_name = "") {
        validator.non_modifying();
        validators_.push_back(std::move(validator));
        if(!validator_name.empty())
            validators_.back().name(validator_name);
        return this;
    }